

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::scroll_(Fl_Text_Display *this,int topLineNum,int horizOffset)

{
  int iVar1;
  int local_20;
  int local_1c;
  int horizOffset_local;
  int topLineNum_local;
  Fl_Text_Display *this_local;
  
  local_1c = topLineNum;
  if ((this->mNBufferLines + 3) - this->mNVisibleLines < topLineNum) {
    local_1c = (this->mNBufferLines + 3) - this->mNVisibleLines;
  }
  if (local_1c < 1) {
    local_1c = 1;
  }
  iVar1 = longest_vline(this);
  local_20 = horizOffset;
  if (iVar1 - (this->text_area).w < horizOffset) {
    local_20 = longest_vline(this);
    local_20 = local_20 - (this->text_area).w;
  }
  if (local_20 < 0) {
    local_20 = 0;
  }
  if ((this->mHorizOffset == local_20) && (this->mTopLineNum == local_1c)) {
    this_local._4_4_ = 0;
  }
  else {
    offset_line_starts(this,local_1c);
    this->mHorizOffset = local_20;
    Fl_Widget::damage((Fl_Widget *)this,'\x02');
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::scroll_(int topLineNum, int horizOffset) {
  /* Limit the requested scroll position to allowable values */
  if (topLineNum > mNBufferLines + 3 - mNVisibleLines)
    topLineNum = mNBufferLines + 3 - mNVisibleLines;
  if (topLineNum < 1) topLineNum = 1;

  if (horizOffset > longest_vline() - text_area.w)
    horizOffset = longest_vline() - text_area.w;
  if (horizOffset < 0) horizOffset = 0;

  /* Do nothing if scroll position hasn't actually changed or there's no
   window to draw in yet */
  if (mHorizOffset == horizOffset && mTopLineNum == topLineNum)
    return 0;

  /* If the vertical scroll position has changed, update the line
   starts array and related counters in the text display */
  offset_line_starts(topLineNum);

  /* Just setting mHorizOffset is enough information for redisplay */
  mHorizOffset = horizOffset;

  // redraw all text
  damage(FL_DAMAGE_EXPOSE);
  return 1;
}